

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

StatusOr<google::protobuf::FeatureResolver> * __thiscall
google::protobuf::(anonymous_namespace)::
SetupFeatureResolver<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,
          _anonymous_namespace_ *this,Edition edition,
          ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
          extensions)

{
  Descriptor *this_00;
  Descriptor *descriptor;
  undefined4 in_register_00000014;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_00;
  Edition in_stack_ffffffffffffff88;
  Status _status;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
  extensions_local;
  
  extensions_local.default_value_ = (InitType)CONCAT44(in_register_00000014,edition);
  extensions_local.number_ = (int)this;
  this_00 = FeatureSet::GetDescriptor();
  descriptor = FeatureSet::GetDescriptor();
  _status.rep_ = (uintptr_t)
                 GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
                           (&extensions_local,descriptor);
  extensions_00.len_ = 1000;
  extensions_00.ptr_ = (pointer)0x1;
  FeatureResolver::CompileDefaults
            (&defaults,(FeatureResolver *)this_00,(Descriptor *)&_status,extensions_00,
             EDITION_99997_TEST_ONLY,in_stack_ffffffffffffff88);
  absl::lts_20250127::Status::Status(&_status,(Status *)&defaults);
  if (_status.rep_ == 1) {
    absl::lts_20250127::Status::~Status(&_status);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    EnsureOk(&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>);
    FeatureResolver::Create
              (__return_storage_ptr__,EDITION_2023,
               &defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1.data_);
  }
  else {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
    StatusOrData<const_absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
               &_status);
    absl::lts_20250127::Status::~Status(&_status);
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData(&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureResolver> SetupFeatureResolver(Edition edition,
                                                     Extensions... extensions) {
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(),
                                       {GetExtension(extensions)...},
                                       EDITION_2023, EDITION_99997_TEST_ONLY);
  RETURN_IF_ERROR(defaults.status());
  return FeatureResolver::Create(edition, *defaults);
}